

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall CTcParser::create_sym_node(CTcParser *this,textchar_t *sym,size_t sym_len)

{
  CTcPrsDbgSymtab *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  CTcPrsNode *pCVar4;
  undefined *puVar5;
  CTPNSymDebugLocalBase *this_00;
  CTcPrsSymtab *unaff_RBP;
  CTcPrsSymtab *curtab;
  CTcPrsSymtab *pCVar6;
  tcprsdbg_sym_info info;
  tcprsdbg_sym_info local_40;
  CTcPrsNodeBase CVar3;
  
  pCVar6 = this->local_symtab_;
  do {
    iVar2 = (*pCVar6->_vptr_CTcPrsSymtab[2])(pCVar6,sym,sym_len);
    CVar3._vptr_CTcPrsNodeBase = (_func_int **)CONCAT44(extraout_var,iVar2);
    if (CVar3._vptr_CTcPrsNodeBase != (_func_int **)0x0) goto LAB_0022fdd7;
    pCVar6 = pCVar6->parent_;
  } while (pCVar6 != (CTcPrsSymtab *)0x0);
  CVar3._vptr_CTcPrsNodeBase = (_func_int **)0x0;
  pCVar6 = unaff_RBP;
LAB_0022fdd7:
  if ((CVar3._vptr_CTcPrsNodeBase == (_func_int **)0x0) ||
     ((**(code **)(*CVar3._vptr_CTcPrsNodeBase + 0x78))(CVar3._vptr_CTcPrsNodeBase),
     pCVar6 == this->global_symtab_)) {
    pCVar1 = this->debug_symtab_;
    if ((pCVar1 != (CTcPrsDbgSymtab *)0x0) &&
       (iVar2 = (*(code *)**(undefined8 **)pCVar1)(pCVar1,sym,sym_len,&local_40), iVar2 != 0)) {
      this_00 = (CTPNSymDebugLocalBase *)CTcPrsMem::alloc(G_prsmem,0x18);
      CTPNSymDebugLocalBase::CTPNSymDebugLocalBase(this_00,&local_40);
      (this_00->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)&PTR_gen_code_00362bf8;
      return &this_00->super_CTcPrsNode;
    }
    this->self_referenced_ = 1;
    pCVar4 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x18);
    pCVar4[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)sym;
    pCVar4[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)sym_len;
    puVar5 = &CTPNSym::vtable;
  }
  else {
    pCVar4 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x10);
    pCVar4[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = CVar3._vptr_CTcPrsNodeBase;
    puVar5 = &CTPNSymResolved::vtable;
  }
  (pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)(puVar5 + 0x10);
  return pCVar4;
}

Assistant:

CTcPrsNode *CTcParser::create_sym_node(const textchar_t *sym, size_t sym_len)
{
    /* 
     *   First, look up the symbol in local scope.  Local scope symbols
     *   can always be resolved during parsing, because the language
     *   requires that local scope items be declared before their first
     *   use. 
     */
    CTcPrsSymtab *symtab;
    CTcSymbol *entry = local_symtab_->find(sym, sym_len, &symtab);

    /* if we found it in local scope, return a resolved symbol node */
    if (entry != 0 && symtab != global_symtab_)
        return new CTPNSymResolved(entry);

    /* if there's a debugger local scope, look it up there */
    if (debug_symtab_ != 0)
    {
        /* look it up in the debug symbol table */
        tcprsdbg_sym_info info;
        if (debug_symtab_->find_symbol(sym, sym_len, &info))
        {
            /* found it - return a debugger local variable */
            return new CTPNSymDebugLocal(&info);
        }
    }

    /* 
     *   We didn't find it in local scope, so the symbol cannot be resolved
     *   until code generation - return an unresolved symbol node.  Note a
     *   possible implicit self-reference, since this could be a property of
     *   'self'.  
     */
    set_self_referenced(TRUE);
    return new CTPNSym(sym, sym_len);
}